

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall
tcu::x11::glx::GlxDisplay::GlxDisplay(GlxDisplay *this,EventState *eventState,char *name)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  undefined4 uVar3;
  char *__s;
  NotSupportedError *this_00;
  TestError *this_01;
  int in_ECX;
  allocator<char> local_231;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  undefined1 local_200 [48];
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  bool local_1a8;
  istringstream extStream;
  
  XlibDisplay::XlibDisplay(&this->super_XlibDisplay,eventState,name);
  (this->super_XlibDisplay).super_DisplayBase._vptr_DisplayBase =
       (_func_int **)&PTR__GlxDisplay_00a05010;
  p_Var1 = &(this->m_extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = glXQueryExtension((this->super_XlibDisplay).m_display,&this->m_errorBase,
                            &this->m_eventBase);
  if (iVar2 == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    NotSupportedError::NotSupportedError
              (this_00,"GLX protocol not supported by X server",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
               ,0xe4);
    __cxa_throw(this_00,&NotSupportedError::typeinfo,Exception::~Exception);
  }
  iVar2 = glXQueryVersion((this->super_XlibDisplay).m_display,&this->m_majorVersion,
                          &this->m_minorVersion);
  checkGLX<int>(iVar2,"glXQueryVersion(m_display, &m_majorVersion, &m_minorVersion)",(char *)0xe6,
                in_ECX);
  uVar3 = XDefaultScreen((this->super_XlibDisplay).m_display);
  __s = (char *)glXQueryServerString((this->super_XlibDisplay).m_display,uVar3,3);
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,__s,&local_231);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&extStream,(string *)&local_230,_S_in);
    std::__cxx11::string::~string((string *)&local_230);
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                        *)local_200,(istream_type *)&extStream);
    local_1d0 = (undefined1  [8])0x0;
    local_1c8._M_p = (pointer)&local_1b8;
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_1a8 = false;
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    set<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>>
              ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_230,
               (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                *)local_200,
               (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                *)local_1d0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->m_extensions)._M_t,&local_230);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_230);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::istringstream::~istringstream((istringstream *)&extStream);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_01,"GLX call failed","glXQueryServerString(m_display, screen, GLX_EXTENSIONS)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11GlxPlatform.cpp"
             ,0xed);
  __cxa_throw(this_01,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

GlxDisplay::GlxDisplay (EventState& eventState, const char* name)
	: XlibDisplay	(eventState, name)
{
	const Bool supported = glXQueryExtension(m_display, &m_errorBase, &m_eventBase);
	if (!supported)
		TCU_THROW(NotSupportedError, "GLX protocol not supported by X server");

	TCU_CHECK_GLX(glXQueryVersion(m_display, &m_majorVersion, &m_minorVersion));

	{
		const int screen = XDefaultScreen(m_display);
		// nVidia doesn't seem to report client-side extensions correctly,
		// so only use server side
		const char* const extensions =
			TCU_CHECK_GLX(glXQueryServerString(m_display, screen, GLX_EXTENSIONS));
		istringstream extStream(extensions);
		m_extensions = set<string>(istream_iterator<string>(extStream),
								   istream_iterator<string>());
	}
}